

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleDateFormat::matchString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,UnicodeString *monthPattern,Calendar *cal)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  SimpleFormatter local_128;
  undefined1 local_e0 [8];
  UnicodeString leapMonthName;
  UErrorCode status;
  int32_t local_8c;
  int32_t matchLen;
  int32_t isLeapMonth;
  UnicodeString bestMatchName;
  int local_40;
  int32_t bestMatch;
  int32_t bestMatchLength;
  int32_t count;
  int32_t i;
  int32_t dataCount_local;
  UnicodeString *data_local;
  UCalendarDateFields field_local;
  int32_t start_local;
  UnicodeString *text_local;
  SimpleDateFormat *this_local;
  
  bestMatchLength = (int32_t)(field == UCAL_DAY_OF_WEEK);
  local_40 = 0;
  bestMatchName.fUnion._52_4_ = 0xffffffff;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&matchLen);
  local_8c = 0;
  for (; bestMatchLength < dataCount; bestMatchLength = bestMatchLength + 1) {
    iVar2 = matchStringWithOptionalDot(text,start,data + bestMatchLength);
    if (local_40 < iVar2) {
      bestMatchName.fUnion._52_4_ = bestMatchLength;
      local_40 = iVar2;
    }
    if (monthPattern != (UnicodeString *)0x0) {
      leapMonthName.fUnion._48_4_ = 0;
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_e0);
      SimpleFormatter::SimpleFormatter
                (&local_128,monthPattern,1,1,
                 (UErrorCode *)(leapMonthName.fUnion.fStackFields.fBuffer + 0x17));
      SimpleFormatter::format
                (&local_128,data + bestMatchLength,(UnicodeString *)local_e0,
                 (UErrorCode *)(leapMonthName.fUnion.fStackFields.fBuffer + 0x17));
      SimpleFormatter::~SimpleFormatter(&local_128);
      UVar1 = ::U_SUCCESS(leapMonthName.fUnion._48_4_);
      if ((UVar1 != '\0') &&
         (iVar2 = matchStringWithOptionalDot(text,start,(UnicodeString *)local_e0), local_40 < iVar2
         )) {
        bestMatchName.fUnion._52_4_ = bestMatchLength;
        local_8c = 1;
        local_40 = iVar2;
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_e0);
    }
  }
  if ((int)bestMatchName.fUnion._52_4_ < 0) {
    this_local._4_4_ = -start;
  }
  else {
    if ((int)field < 0x17) {
      iVar3 = (*(cal->super_UObject)._vptr_UObject[0x17])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"hebrew");
      if (((iVar3 == 0) && (field == UCAL_MONTH)) && (bestMatchName.fUnion._52_4_ == 0xd)) {
        Calendar::set(cal,UCAL_MONTH,6);
      }
      else {
        if (field == UCAL_YEAR) {
          bestMatchName.fUnion._52_4_ = bestMatchName.fUnion._52_4_ + 1;
        }
        Calendar::set(cal,field,bestMatchName.fUnion._52_4_);
      }
      if (monthPattern != (UnicodeString *)0x0) {
        Calendar::set(cal,UCAL_IS_LEAP_MONTH,local_8c);
      }
    }
    this_local._4_4_ = start + local_40;
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&matchLen);
  return this_local._4_4_;
}

Assistant:

int32_t SimpleDateFormat::matchString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              const UnicodeString* monthPattern,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    if (field == UCAL_DAY_OF_WEEK) i = 1;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;
    int32_t isLeapMonth = 0;

    for (; i < count; ++i) {
        int32_t matchLen = 0;
        if ((matchLen = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatch = i;
            bestMatchLength = matchLen;
        }

        if (monthPattern != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            UnicodeString leapMonthName;
            SimpleFormatter(*monthPattern, 1, 1, status).format(data[i], leapMonthName, status);
            if (U_SUCCESS(status)) {
                if ((matchLen = matchStringWithOptionalDot(text, start, leapMonthName)) > bestMatchLength) {
                    bestMatch = i;
                    bestMatchLength = matchLen;
                    isLeapMonth = 1;
                }
            }
        }
    }

    if (bestMatch >= 0) {
        if (field < UCAL_FIELD_COUNT) {
            // Adjustment for Hebrew Calendar month Adar II
            if (!strcmp(cal.getType(),"hebrew") && field==UCAL_MONTH && bestMatch==13) {
                cal.set(field,6);
            } else {
                if (field == UCAL_YEAR) {
                    bestMatch++; // only get here for cyclic year names, which match 1-based years 1-60
                }
                cal.set(field, bestMatch);
            }
            if (monthPattern != NULL) {
                cal.set(UCAL_IS_LEAP_MONTH, isLeapMonth);
            }
        }

        return start + bestMatchLength;
    }

    return -start;
}